

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.cpp
# Opt level: O3

double __thiscall anon_unknown.dwarf_4f2b2::ExprEval::ParseAtom(ExprEval *this,char **expr)

{
  char cVar1;
  char cVar2;
  char *in_RAX;
  char *pcVar3;
  char *pcVar4;
  double dVar5;
  char *end_ptr;
  char *local_28;
  
  pcVar3 = *expr;
  cVar1 = *pcVar3;
  while (cVar1 == ' ') {
    pcVar3 = pcVar3 + 1;
    *expr = pcVar3;
    cVar1 = *pcVar3;
  }
  cVar2 = cVar1;
  if (cVar1 == '-') {
    *expr = pcVar3 + 1;
    pcVar4 = pcVar3 + 1;
    pcVar3 = pcVar3 + 1;
    cVar2 = *pcVar4;
  }
  pcVar4 = pcVar3;
  if (cVar2 == '+') {
    pcVar4 = pcVar3 + 1;
    *expr = pcVar4;
    cVar2 = pcVar3[1];
  }
  if (cVar2 == '(') {
    *expr = pcVar4 + 1;
    this->_paren_count = this->_paren_count + 1;
    dVar5 = ParseSummands(this,expr);
    pcVar3 = *expr;
    if (*pcVar3 != ')') {
      this->_err = 1;
      this->_err_pos = pcVar3;
      return 0.0;
    }
    *expr = pcVar3 + 1;
    this->_paren_count = this->_paren_count + -1;
  }
  else {
    local_28 = in_RAX;
    dVar5 = strtod(pcVar4,&local_28);
    pcVar3 = *expr;
    if (local_28 == pcVar3) {
      this->_err = 2;
      this->_err_pos = pcVar3;
      return 0.0;
    }
    *expr = local_28;
  }
  if (cVar1 == '-') {
    dVar5 = -dVar5;
  }
  return dVar5;
}

Assistant:

double ParseAtom(const char*& expr) {
            // Skip spaces
            while(*expr == ' ')
                expr++;

            // Handle the sign before parenthesis (or before number)
            bool negative = false;
            if(*expr == '-') {
                negative = true;
                expr++;
            }
            if(*expr == '+') {
                expr++;
            }

            // Check if there is parenthesis
            if(*expr == '(') {
                expr++;
                _paren_count++;
                double res = ParseSummands(expr);
                if(*expr != ')') {
                    // Unmatched opening parenthesis
                    _err = EEE_PARENTHESIS;
                    _err_pos = expr;
                    return 0;
                }
                expr++;
                _paren_count--;
                return negative ? -res : res;
            }

            // It should be a number; convert it to double
            char* end_ptr;
            double res = strtod(expr, &end_ptr);
            if(end_ptr == expr) {
                // Report error
                _err = EEE_WRONG_CHAR;
                _err_pos = expr;
                return 0;
            }
            // Advance the pointer and return the result
            expr = end_ptr;
            return negative ? -res : res;
        }